

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderIndexingTests.cpp
# Opt level: O0

void vkt::sr::anon_unknown_0::evalSubscriptMat3x2(ShaderEvalContext *c)

{
  VecAccess<float,_4,_2> local_58;
  undefined1 local_48 [8];
  Vector<float,_2> local_40;
  undefined1 local_38 [8];
  Vector<float,_2> local_30;
  undefined1 local_28 [8];
  Vector<float,_2> local_20;
  Vector<float,_2> local_18;
  ShaderEvalContext *local_10;
  ShaderEvalContext *c_local;
  
  local_10 = c;
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_28,(int)c,0);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_38,(int)local_10,1);
  tcu::operator*((tcu *)&local_30,0.5,(Vector<float,_2> *)local_38);
  tcu::operator+((tcu *)&local_20,(Vector<float,_2> *)local_28,&local_30);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_48,(int)local_10,2);
  tcu::operator*((tcu *)&local_40,0.25,(Vector<float,_2> *)local_48);
  tcu::operator+((tcu *)&local_18,&local_20,&local_40);
  local_58 = tcu::Vector<float,_4>::xy(&local_10->color);
  tcu::VecAccess<float,_4,_2>::operator=(&local_58,&local_18);
  return;
}

Assistant:

void evalSubscriptMat3x2	(ShaderEvalContext& c) { c.color.xy()	= c.coords.swizzle(0,1) + 0.5f*c.coords.swizzle(1,2) + 0.25f*c.coords.swizzle(2,3); }